

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O2

void __thiscall QGraphicsView::mouseReleaseEvent(QGraphicsView *this,QMouseEvent *event)

{
  QGraphicsViewPrivate *this_00;
  Data *pDVar1;
  bool bVar2;
  MouseEventSource source;
  MouseEventFlags flags;
  QFlagsStorage<Qt::MouseButton> QVar3;
  QWidget *pQVar4;
  QObject *pQVar5;
  long in_FS_OFFSET;
  QPointF QVar6;
  QPointF local_80;
  QPoint local_70;
  QPointF local_68;
  undefined1 local_58 [12];
  char cStack_4c;
  undefined3 uStack_4b;
  QScopedPointer<QGraphicsSceneEventPrivate,_QScopedPointerDeleter<QGraphicsSceneEventPrivate>_>
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsViewPrivate **)(this + 8);
  if (this_00->dragMode == ScrollHandDrag) {
    if (*(int *)(event + 0x40) == 1) {
      pQVar4 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
      QCursor::QCursor((QCursor *)local_58,OpenHandCursor);
      QWidget::setCursor(pQVar4,(QCursor *)local_58);
      QCursor::~QCursor((QCursor *)local_58);
      this_00->field_0x301 = this_00->field_0x301 & 0xfd;
      bVar2 = QPointer::operator_cast_to_bool((QPointer *)&this_00->scene);
      if ((((bVar2) && ((this_00->field_0x300 & 1) != 0)) &&
          ((this_00->lastMouseEvent).field_0.field2[0xc] == '\0')) &&
         (this_00->handScrollMotions < 7)) {
        QGraphicsScene::clearSelection((QGraphicsScene *)(this_00->scene).wp.value);
      }
    }
  }
  else if (((this_00->dragMode == RubberBandDrag) && ((this_00->field_0x300 & 1) != 0)) &&
          (*(int *)(event + 0x44) == 0)) {
    QGraphicsViewPrivate::clearRubberBand(this_00);
  }
  QGraphicsViewPrivate::storeMouseEvent(this_00,event);
  if ((this_00->field_0x300 & 1) != 0) {
    bVar2 = QPointer::operator_cast_to_bool((QPointer *)&this_00->scene);
    if (bVar2) {
      local_48.d = (QGraphicsSceneEventPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      stack0xffffffffffffffb0 = &DAT_aaaaaaaaaaaaaaaa;
      QGraphicsSceneMouseEvent::QGraphicsSceneMouseEvent
                ((QGraphicsSceneMouseEvent *)local_58,GraphicsSceneMouseRelease);
      pQVar4 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
      QGraphicsSceneEvent::setWidget((QGraphicsSceneEvent *)local_58,pQVar4);
      QGraphicsSceneMouseEvent::setButtonDownScenePos
                ((QGraphicsSceneMouseEvent *)local_58,this_00->mousePressButton,
                 &this_00->mousePressScenePoint);
      QGraphicsSceneMouseEvent::setButtonDownScreenPos
                ((QGraphicsSceneMouseEvent *)local_58,this_00->mousePressButton,
                 &this_00->mousePressScreenPoint);
      QVar6 = QSinglePointEvent::position((QSinglePointEvent *)event);
      local_80.yp = QVar6.yp;
      local_80.xp = QVar6.xp;
      local_70 = QPointF::toPoint(&local_80);
      QVar6 = mapToScene(this,&local_70);
      local_68.yp = QVar6.yp;
      local_68.xp = QVar6.xp;
      QGraphicsSceneMouseEvent::setScenePos((QGraphicsSceneMouseEvent *)local_58,&local_68);
      QVar6 = QSinglePointEvent::globalPosition((QSinglePointEvent *)event);
      local_68.yp = QVar6.yp;
      local_68.xp = QVar6.xp;
      local_80.xp = (qreal)QPointF::toPoint(&local_68);
      QGraphicsSceneMouseEvent::setScreenPos
                ((QGraphicsSceneMouseEvent *)local_58,(QPoint *)&local_80);
      QGraphicsSceneMouseEvent::setLastScenePos
                ((QGraphicsSceneMouseEvent *)local_58,&this_00->lastMouseMoveScenePoint);
      QGraphicsSceneMouseEvent::setLastScreenPos
                ((QGraphicsSceneMouseEvent *)local_58,&this_00->lastMouseMoveScreenPoint);
      QGraphicsSceneMouseEvent::setButtons
                ((QGraphicsSceneMouseEvent *)local_58,
                 (QFlagsStorageHelper<Qt::MouseButton,_4>)
                 *(QFlagsStorage<Qt::MouseButton> *)(event + 0x44));
      QGraphicsSceneMouseEvent::setButton
                ((QGraphicsSceneMouseEvent *)local_58,*(MouseButton *)(event + 0x40));
      QGraphicsSceneMouseEvent::setModifiers
                ((QGraphicsSceneMouseEvent *)local_58,
                 (QFlagsStorageHelper<Qt::KeyboardModifier,_4>)
                 *(QFlagsStorage<Qt::KeyboardModifier> *)(event + 0x20));
      source = QMouseEvent::source();
      QGraphicsSceneMouseEvent::setSource((QGraphicsSceneMouseEvent *)local_58,source);
      flags.super_QFlagsStorageHelper<Qt::MouseEventFlag,_4>.super_QFlagsStorage<Qt::MouseEventFlag>
      .i = (QFlagsStorageHelper<Qt::MouseEventFlag,_4>)QMouseEvent::flags();
      QGraphicsSceneMouseEvent::setFlags((QGraphicsSceneMouseEvent *)local_58,flags);
      cStack_4c = 0;
      QGraphicsSceneEvent::setTimestamp((QGraphicsSceneEvent *)local_58,*(quint64 *)(event + 0x18));
      pDVar1 = (this_00->scene).wp.d;
      if (event[0xb] == (QMouseEvent)0x1) {
        if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
          pQVar5 = (QObject *)0x0;
        }
        else {
          pQVar5 = (this_00->scene).wp.value;
        }
        qt_sendSpontaneousEvent(pQVar5,(QEvent *)local_58);
      }
      else {
        if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
          pQVar5 = (QObject *)0x0;
        }
        else {
          pQVar5 = (this_00->scene).wp.value;
        }
        QCoreApplication::sendEvent(pQVar5,(QEvent *)local_58);
      }
      (**(code **)(*(long *)&(this_00->lastMouseEvent).field_0 + 0x10))
                (&this_00->lastMouseEvent,cStack_4c);
      (**(code **)(*(long *)event + 0x10))(event,cStack_4c);
      if (cStack_4c == '\x01') {
        QVar3.i = (Int)QGraphicsSceneMouseEvent::buttons((QGraphicsSceneMouseEvent *)local_58);
        if ((QFlagsStorage<Qt::MouseButton>)QVar3.i == (QFlagsStorage<Qt::MouseButton>)0x0) {
          pQVar4 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
          bVar2 = QWidget::testAttribute_helper(pQVar4,WA_SetCursor);
          if (bVar2) {
            QGraphicsViewPrivate::_q_unsetViewportCursor(this_00);
          }
        }
      }
      QGraphicsSceneHelpEvent::~QGraphicsSceneHelpEvent((QGraphicsSceneHelpEvent *)local_58);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsView::mouseReleaseEvent(QMouseEvent *event)
{
    Q_D(QGraphicsView);

#if QT_CONFIG(rubberband)
    if (d->dragMode == QGraphicsView::RubberBandDrag && d->sceneInteractionAllowed && !event->buttons()) {
        d->clearRubberBand();
    } else
#endif
    if (d->dragMode == QGraphicsView::ScrollHandDrag && event->button() == Qt::LeftButton) {
#ifndef QT_NO_CURSOR
        // Restore the open hand cursor. ### There might be items
        // under the mouse that have a valid cursor at this time, so
        // we could repeat the steps from mouseMoveEvent().
        viewport()->setCursor(Qt::OpenHandCursor);
#endif
        d->handScrolling = false;

        if (d->scene && d->sceneInteractionAllowed && !d->lastMouseEvent->isAccepted() && d->handScrollMotions <= 6) {
            // If we've detected very little motion during the hand drag, and
            // no item accepted the last event, we'll interpret that as a
            // click to the scene, and reset the selection.
            d->scene->clearSelection();
        }
    }

    d->storeMouseEvent(event);

    if (!d->sceneInteractionAllowed)
        return;

    if (!d->scene)
        return;

    QGraphicsSceneMouseEvent mouseEvent(QEvent::GraphicsSceneMouseRelease);
    mouseEvent.setWidget(viewport());
    mouseEvent.setButtonDownScenePos(d->mousePressButton, d->mousePressScenePoint);
    mouseEvent.setButtonDownScreenPos(d->mousePressButton, d->mousePressScreenPoint);
    mouseEvent.setScenePos(mapToScene(event->position().toPoint()));
    mouseEvent.setScreenPos(event->globalPosition().toPoint());
    mouseEvent.setLastScenePos(d->lastMouseMoveScenePoint);
    mouseEvent.setLastScreenPos(d->lastMouseMoveScreenPoint);
    mouseEvent.setButtons(event->buttons());
    mouseEvent.setButton(event->button());
    mouseEvent.setModifiers(event->modifiers());
    mouseEvent.setSource(event->source());
    mouseEvent.setFlags(event->flags());
    mouseEvent.setAccepted(false);
    mouseEvent.setTimestamp(event->timestamp());
    if (event->spontaneous())
        qt_sendSpontaneousEvent(d->scene, &mouseEvent);
    else
        QCoreApplication::sendEvent(d->scene, &mouseEvent);

    // Update the last and current mouse events' accepted state.
    d->lastMouseEvent->setAccepted(mouseEvent.isAccepted());
    event->setAccepted(mouseEvent.isAccepted());

#ifndef QT_NO_CURSOR
    if (mouseEvent.isAccepted() && mouseEvent.buttons() == 0 && viewport()->testAttribute(Qt::WA_SetCursor)) {
        // The last mouse release on the viewport will trigger clearing the cursor.
        d->_q_unsetViewportCursor();
    }
#endif
}